

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_DefinePropertyValueStr(JSContext *ctx,JSValue this_obj,char *prop,JSValue val,int flags)

{
  JSAtom prop_00;
  int iVar1;
  
  prop_00 = JS_NewAtom(ctx,prop);
  iVar1 = JS_DefinePropertyValue(ctx,this_obj,prop_00,val,flags);
  JS_FreeAtom(ctx,prop_00);
  return iVar1;
}

Assistant:

int JS_DefinePropertyValueStr(JSContext *ctx, JSValueConst this_obj,
                              const char *prop, JSValue val, int flags)
{
    JSAtom atom;
    int ret;
    atom = JS_NewAtom(ctx, prop);
    ret = JS_DefinePropertyValue(ctx, this_obj, atom, val, flags);
    JS_FreeAtom(ctx, atom);
    return ret;
}